

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack16_32(uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0xffff;
  out[1] = *in >> 0x10;
  out[2] = in[1] & 0xffff;
  out[3] = in[1] >> 0x10;
  out[4] = in[2] & 0xffff;
  out[5] = in[2] >> 0x10;
  out[6] = in[3] & 0xffff;
  out[7] = in[3] >> 0x10;
  out[8] = in[4] & 0xffff;
  out[9] = in[4] >> 0x10;
  out[10] = in[5] & 0xffff;
  out[0xb] = in[5] >> 0x10;
  out[0xc] = in[6] & 0xffff;
  out[0xd] = in[6] >> 0x10;
  out[0xe] = in[7] & 0xffff;
  out[0xf] = in[7] >> 0x10;
  out[0x10] = in[8] & 0xffff;
  out[0x11] = in[8] >> 0x10;
  out[0x12] = in[9] & 0xffff;
  out[0x13] = in[9] >> 0x10;
  out[0x14] = in[10] & 0xffff;
  out[0x15] = in[10] >> 0x10;
  out[0x16] = in[0xb] & 0xffff;
  out[0x17] = in[0xb] >> 0x10;
  out[0x18] = in[0xc] & 0xffff;
  out[0x19] = in[0xc] >> 0x10;
  out[0x1a] = in[0xd] & 0xffff;
  out[0x1b] = in[0xd] >> 0x10;
  out[0x1c] = in[0xe] & 0xffff;
  out[0x1d] = in[0xe] >> 0x10;
  out[0x1e] = in[0xf] & 0xffff;
  out[0x1f] = in[0xf] >> 0x10;
  return in + 0x10;
}

Assistant:

const uint32_t *__fastunpack16_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;

  return in;
}